

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O2

string * cg_default_value_for_type(string *__return_storage_ptr__,string *type)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  allocator local_19;
  
  bVar1 = std::operator==(type,"bool");
  if (!bVar1) {
    bVar1 = std::operator==(type,"boolean");
    if (!bVar1) {
      bVar1 = std::operator==(type,"char");
      if (!bVar1) {
        bVar1 = std::operator==(type,"unsigned char");
        if (!bVar1) {
          bVar1 = std::operator==(type,"short");
          if (!bVar1) {
            bVar1 = std::operator==(type,"unsigned short");
            if (!bVar1) {
              bVar1 = std::operator==(type,"int");
              if (!bVar1) {
                bVar1 = std::operator==(type,"unsigned int");
                if (!bVar1) {
                  bVar1 = std::operator==(type,"unsigned");
                  if (!bVar1) {
                    bVar1 = std::operator==(type,"long");
                    if (!bVar1) {
                      bVar1 = std::operator==(type,"unsigned long");
                      if (!bVar1) {
                        bVar1 = std::operator==(type,"long long");
                        if (!bVar1) {
                          bVar1 = std::operator==(type,"unsigned long long");
                          if (!bVar1) {
                            bVar1 = std::operator==(type,"float");
                            if (bVar1) {
                              pcVar3 = "0.0f";
                            }
                            else {
                              bVar1 = std::operator==(type,"double");
                              if (bVar1) {
                                pcVar3 = "0.0";
                              }
                              else {
                                lVar2 = std::__cxx11::string::find((char *)type,0x11daf2);
                                if (lVar2 == -1) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = "nullptr";
                                }
                              }
                            }
                            goto LAB_00116e6d;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      pcVar3 = "0";
      goto LAB_00116e6d;
    }
  }
  pcVar3 = "false";
LAB_00116e6d:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_19);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cg_default_value_for_type(const std::string &type)
{
    if (type == "bool") return "false";
    else if (type == "boolean") return "false";
    else if (type == "char") return "0";
    else if (type == "unsigned char") return "0";
    else if (type == "short") return "0";
    else if (type == "unsigned short") return "0";
    else if (type == "int") return "0";
    else if (type == "unsigned int") return "0";
    else if (type == "unsigned") return "0";
    else if (type == "long") return "0";
    else if (type == "unsigned long") return "0";
    else if (type == "long long") return "0";
    else if (type == "unsigned long long") return "0";
    else if (type == "float") return "0.0f";
    else if (type == "double") return "0.0";
    else if (type.find("*") != std::string::npos) return "nullptr";
    return "";
}